

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

char * __thiscall IrSim::print1(IrSim *this,C_IC *i)

{
  char *__format;
  undefined8 uVar1;
  int *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffac;
  InterCode *this_00;
  Operand *this_01;
  string local_30 [48];
  
  this_00 = *(InterCode **)(in_RDI + 0x68);
  this_01 = *(Operand **)(in_RDI + 0x60);
  __format = icFmt[*in_RSI];
  InterCode::operator[](this_00,in_stack_ffffffffffffffac);
  Operand::str_abi_cxx11_(this_01);
  uVar1 = std::__cxx11::string::c_str();
  snprintf((char *)this_00,(size_t)this_01,__format,uVar1);
  std::__cxx11::string::~string(local_30);
  return *(char **)(in_RDI + 0x68);
}

Assistant:

const char *IrSim::print1(C_IC &i) const {
    snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str());
    return pb;
}